

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool wallet::anon_unknown_1::HaveKeys
               (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *pubkeys,LegacyDataSPKM *keystore)

{
  pointer pvVar1;
  pointer pvVar2;
  int iVar3;
  pointer pvVar4;
  valtype *pubkey;
  long in_FS_OFFSET;
  CKeyID keyID;
  CPubKey local_85;
  CKeyID local_44;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar1 = (pubkeys->
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (pubkeys->
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    pvVar4 = pvVar2;
    if (pvVar4 == pvVar1) break;
    CPubKey::Set<unsigned_char_const*>
              (&local_85,
               (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    CPubKey::GetID(&local_44,&local_85);
    iVar3 = (*(keystore->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1d])(keystore,&local_44);
    pvVar2 = pvVar4 + 1;
  } while ((char)iVar3 != '\0');
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pvVar4 == pvVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool HaveKeys(const std::vector<valtype>& pubkeys, const LegacyDataSPKM& keystore)
{
    for (const valtype& pubkey : pubkeys) {
        CKeyID keyID = CPubKey(pubkey).GetID();
        if (!keystore.HaveKey(keyID)) return false;
    }
    return true;
}